

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O3

void Gia_ManReprFromAigRepr(Aig_Man_t *pAig,Gia_Man_t *pGia)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  void *pvVar4;
  Gia_Rpr_t *pGVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  Vec_Ptr_t *pVVar10;
  
  if (pAig->pReprs == (Aig_Obj_t **)0x0) {
    __assert_fail("pAig->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                  ,0x1ed,"void Gia_ManReprFromAigRepr(Aig_Man_t *, Gia_Man_t *)");
  }
  if (pGia->pReprs != (Gia_Rpr_t *)0x0) {
    __assert_fail("pGia->pReprs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                  ,0x1ee,"void Gia_ManReprFromAigRepr(Aig_Man_t *, Gia_Man_t *)");
  }
  iVar1 = pGia->nObjs;
  if (iVar1 - pGia->vCos->nSize != pAig->vObjs->nSize - (pAig->nDeleted + pAig->nObjs[3])) {
    __assert_fail("Gia_ManObjNum(pGia) - Gia_ManCoNum(pGia) == Aig_ManObjNum(pAig) - Aig_ManCoNum(pAig)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                  ,0x1ef,"void Gia_ManReprFromAigRepr(Aig_Man_t *, Gia_Man_t *)");
  }
  pGVar5 = (Gia_Rpr_t *)calloc((long)iVar1,4);
  pGia->pReprs = pGVar5;
  if (0 < iVar1) {
    lVar6 = 0;
    do {
      pGia->pReprs[lVar6] = (Gia_Rpr_t)((uint)pGia->pReprs[lVar6] | 0xfffffff);
      lVar6 = lVar6 + 1;
      uVar9 = (ulong)pGia->nObjs;
    } while (lVar6 < (long)uVar9);
    if (0 < pGia->nObjs) {
      lVar6 = 8;
      lVar8 = 0;
      do {
        pGVar3 = pGia->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        uVar2 = *(uint *)((long)pGVar3 + lVar6 + -8);
        if (-1 < (int)uVar2 || (~uVar2 & 0x1fffffff) == 0) {
          uVar2 = *(uint *)(&pGVar3->field_0x0 + lVar6);
          if (lVar8 == 0) {
            if ((int)uVar2 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
          }
          else {
            if ((int)uVar2 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            if ((uVar2 & 1) != 0) {
              __assert_fail("i == 0 || !Abc_LitIsCompl(Gia_ObjValue(pObjGia))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                            ,0x1f8,"void Gia_ManReprFromAigRepr(Aig_Man_t *, Gia_Man_t *)");
            }
          }
          if (pAig->vObjs->nSize <= (int)(uVar2 >> 1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          *(int *)((long)pAig->vObjs->pArray[uVar2 >> 1] + 0x28) = (int)lVar8;
          uVar9 = (ulong)(uint)pGia->nObjs;
        }
        lVar8 = lVar8 + 1;
        lVar6 = lVar6 + 0xc;
      } while (lVar8 < (int)uVar9);
    }
  }
  pVVar10 = pAig->vObjs;
  if (0 < pVVar10->nSize) {
    lVar6 = 0;
    do {
      pvVar4 = pVVar10->pArray[lVar6];
      if (((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x18) & 7) != 3)) &&
         (pAig->pReprs[lVar6] != (Aig_Obj_t *)0x0)) {
        iVar1 = *(int *)((long)pvVar4 + 0x28);
        uVar2 = (pAig->pReprs[lVar6]->field_5).iData;
        if ((uVar2 != 0xfffffff) && (iVar1 <= (int)uVar2)) {
          __assert_fail("Num == GIA_VOID || Num < Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x401,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
        }
        pGia->pReprs[iVar1] =
             (Gia_Rpr_t)((uint)pGia->pReprs[iVar1] & 0xf0000000 | uVar2 & 0xfffffff);
        pVVar10 = pAig->vObjs;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar10->nSize);
  }
  piVar7 = Gia_ManDeriveNexts(pGia);
  pGia->pNexts = piVar7;
  return;
}

Assistant:

void Gia_ManReprFromAigRepr( Aig_Man_t * pAig, Gia_Man_t * pGia )
{
    Gia_Obj_t * pObjGia; 
    Aig_Obj_t * pObjAig, * pReprAig;
    int i;
    assert( pAig->pReprs != NULL );
    assert( pGia->pReprs == NULL );
    assert( Gia_ManObjNum(pGia) - Gia_ManCoNum(pGia) == Aig_ManObjNum(pAig) - Aig_ManCoNum(pAig) );
    pGia->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(pGia) );
    for ( i = 0; i < Gia_ManObjNum(pGia); i++ )
        Gia_ObjSetRepr( pGia, i, GIA_VOID );
    // move pointers from GIA to AIG
    Gia_ManForEachObj( pGia, pObjGia, i )
    {
        if ( Gia_ObjIsCo(pObjGia) )
            continue;
        assert( i == 0 || !Abc_LitIsCompl(Gia_ObjValue(pObjGia)) );
        pObjAig  = Aig_ManObj( pAig, Abc_Lit2Var(Gia_ObjValue(pObjGia)) );
        pObjAig->iData = i;
    }
    Aig_ManForEachObj( pAig, pObjAig, i )
    {
        if ( Aig_ObjIsCo(pObjAig) )
            continue;
        if ( pAig->pReprs[i] == NULL )
            continue;
        pReprAig = pAig->pReprs[i];
        Gia_ObjSetRepr( pGia, pObjAig->iData, pReprAig->iData );
    }
    pGia->pNexts = Gia_ManDeriveNexts( pGia );
}